

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bup.cpp
# Opt level: O2

int processBup(istream *in,path *output)

{
  uint32_t uVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  bool bVar5;
  Point PVar6;
  pointer __rhs;
  pointer pBVar7;
  ulong uVar8;
  long *local_2b0;
  pointer local_2a8;
  string local_298;
  string local_270;
  Image withMouth;
  Image base;
  Image withEyes;
  BupHeader header;
  string outTemplate;
  Image currentChunk;
  vector<MaskRect,_std::allocator<MaskRect>_> maskData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [32];
  path local_f8;
  path outputDir;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Vector_base<MaskRect,_std::allocator<MaskRect>_> local_68;
  Size local_50;
  _Vector_base<Color,_std::allocator<Color>_> local_48;
  
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::stem((path *)&header,output);
  std::filesystem::__cxx11::path::string(&outTemplate,(path *)&header);
  std::filesystem::__cxx11::path::~path((path *)&header);
  if (SAVE_BUP_AS_PARTS == true) {
    BupOutputter::makeParts();
  }
  else {
    BupOutputter::makeComposited();
  }
  header.expChunks.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  header.expChunks.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header.chunks.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header.expChunks.super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  operator>>(in,&header);
  Image::Image(&base,(Size)((ulong)header.height << 0x20 | (ulong)header.width),(Color)0x0);
  Image::Image(&currentChunk,(Size)0x0,(Color)0x0);
  pBVar2 = header.chunks.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2a8 = header.chunks.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
              super__Vector_impl_data._M_start;
  for (pBVar7 = header.chunks.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar3 = header.chunks.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
               super__Vector_impl_data._M_start, pBVar7 != pBVar2; pBVar7 = pBVar7 + 1) {
    uVar1 = pBVar7->offset;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&withMouth,
                   &outTemplate,"_BaseChunk");
    std::__cxx11::to_string(&local_270,(long)local_2a8 - (long)pBVar3 >> 2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&withEyes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&withMouth,
                   &local_270);
    PVar6 = processChunk(&currentChunk,&maskData,uVar1,in,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &withEyes,header.isSwitch);
    std::__cxx11::string::~string((string *)&withEyes);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&withMouth);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)&local_68,&maskData);
    Image::drawOnto(&currentChunk,&base,PVar6,
                    (vector<MaskRect,_std::allocator<MaskRect>_> *)&local_68);
    std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base(&local_68);
    local_2a8 = local_2a8 + 1;
  }
  if (SHOULD_WRITE_DEBUG_IMAGES != false) {
    std::operator+(&local_270,&outTemplate,"_Base.png");
    std::filesystem::__cxx11::path::path((path *)&withMouth,&local_270,auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)&withEyes,&debugImagePath_abi_cxx11_,(path *)&withMouth);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"",(allocator<char> *)&local_138);
    Image::writePNG(&base,(path *)&withEyes,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::filesystem::__cxx11::path::~path((path *)&withEyes);
    std::filesystem::__cxx11::path::~path((path *)&withMouth);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::filesystem::__cxx11::path::path(&local_f8,&outputDir);
  local_50 = base.size;
  local_48._M_impl.super__Vector_impl_data._M_start =
       base.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       base.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       base.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  base.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  base.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  base.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(local_118,(string *)&outTemplate);
  (**(code **)(*local_2b0 + 0x10))(local_2b0,&local_f8,&local_50,local_118);
  std::__cxx11::string::~string(local_118);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base(&local_48);
  std::filesystem::__cxx11::path::~path(&local_f8);
  Image::Image(&withEyes,(Size)0x0,(Color)0x0);
  pBVar4 = header.expChunks.
           super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__rhs = header.expChunks.
               super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
               super__Vector_impl_data._M_start; __rhs != pBVar4; __rhs = __rhs + 1) {
    Image::operator=(&withEyes,&base);
    uVar1 = (__rhs->face).offset;
    if (uVar1 == 0) {
      Image::Image(&withMouth,(Size)0x0,(Color)0x0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"",(allocator<char> *)&local_138);
      local_298._M_dataplus._M_p = (pointer)0x0;
      local_298._M_string_length = 0;
      local_298.field_2._M_allocated_capacity = 0;
      (**(code **)(*local_2b0 + 0x18))(local_2b0,&withMouth,0,&local_270,&local_298);
      std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base
                ((_Vector_base<MaskRect,_std::allocator<MaskRect>_> *)&local_298);
      std::__cxx11::string::~string((string *)&local_270);
      std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                (&withMouth.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
    }
    else {
      std::operator+(&local_298,&outTemplate,"_");
      std::operator+(&local_270,&local_298,&__rhs->name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&withMouth
                     ,&local_270,"_Face");
      PVar6 = processChunk(&currentChunk,&maskData,uVar1,in,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &withMouth,header.isSwitch);
      std::__cxx11::string::~string((string *)&withMouth);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_298);
      (**(code **)(*local_2b0 + 0x18))(local_2b0,&currentChunk,PVar6,__rhs,&maskData);
    }
    uVar8 = 0;
    bVar5 = false;
    while( true ) {
      pBVar2 = (__rhs->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(__rhs->mouths).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 2) <= uVar8)
      break;
      if (pBVar2[uVar8].offset != 0) {
        Image::Image(&withMouth,&withEyes);
        uVar1 = pBVar2[uVar8].offset;
        std::operator+(&local_88,&outTemplate,"_");
        std::operator+(&local_138,&local_88,&__rhs->name);
        std::operator+(&local_298,&local_138,"_Mouth");
        std::__cxx11::to_string(&local_a8,(int)uVar8);
        std::operator+(&local_270,&local_298,&local_a8);
        PVar6 = processChunk(&currentChunk,&maskData,uVar1,in,&local_270,header.isSwitch);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_88);
        (**(code **)(*local_2b0 + 0x20))(local_2b0,&currentChunk,PVar6,uVar8 & 0xffffffff,&maskData)
        ;
        (**(code **)(*local_2b0 + 0x28))();
        std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                  (&withMouth.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
        bVar5 = true;
      }
      uVar8 = uVar8 + 1;
    }
    if (!bVar5) {
      (**(code **)(*local_2b0 + 0x28))();
    }
  }
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&withEyes.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base
            (&maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&base.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  BupHeader::~BupHeader(&header);
  if (local_2b0 != (long *)0x0) {
    (**(code **)(*local_2b0 + 8))();
  }
  std::__cxx11::string::~string((string *)&outTemplate);
  std::filesystem::__cxx11::path::~path(&outputDir);
  return 0;
}

Assistant:

int processBup(std::istream &in, const fs::path &output) {
	fs::path outputDir = output.parent_path();
	std::string outTemplate = output.stem().string();

	std::unique_ptr<BupOutputter> out = SAVE_BUP_AS_PARTS ? BupOutputter::makeParts() : BupOutputter::makeComposited();

	BupHeader header;
	in >> header;

	Image base({header.width, header.height}), currentChunk({0, 0});
	std::vector<MaskRect> maskData;

	for (const auto& chunk : header.chunks) {
		size_t i = &chunk - &header.chunks[0];

		Point pos = processChunk(currentChunk, maskData, chunk.offset, in, outTemplate + "_BaseChunk" + std::to_string(i), header.isSwitch);

		currentChunk.drawOnto(base, pos, maskData);
	}
	if (SHOULD_WRITE_DEBUG_IMAGES) {
		base.writePNG(debugImagePath/(outTemplate + "_Base.png"));
	}

	out->setBase(outputDir, std::move(base), outTemplate);

	Image withEyes({0, 0});

	for (const auto& expChunk : header.expChunks) {
		withEyes = base;

		if (expChunk.face.offset) {
			Point facePos = processChunk(currentChunk, maskData, expChunk.face.offset, in, outTemplate + "_" + expChunk.name + "_Face", header.isSwitch);
			out->newFace(currentChunk, facePos, expChunk.name, maskData);
		} else {
			out->newFace(Image(), {0, 0}, "", {});
		}

		bool atLeastOneMouth = false;
		for (int i = 0; i < expChunk.mouths.size(); i++) {
			const auto& mouth = expChunk.mouths[i];

			if (!mouth.offset) { continue; }
			atLeastOneMouth = true;

			Image withMouth = withEyes;

			Point mouthPos = processChunk(currentChunk, maskData, mouth.offset, in, outTemplate + "_" + expChunk.name + "_Mouth" + std::to_string(i), header.isSwitch);
			out->newMouth(currentChunk, mouthPos, i, maskData);
			out->write();
		}
		if (!atLeastOneMouth) {
			out->write();
		}
	}

	return 0;
}